

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_debug_getmetatable(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  int iVar2;
  TRef TVar3;
  TRef TVar4;
  TRef TVar5;
  IRRef1 IVar6;
  uint uVar7;
  ulong uVar8;
  GCobj *o;
  bool bVar9;
  
  uVar1 = *J->base;
  uVar7 = uVar1 & 0x1f000000;
  if (uVar7 == 0xb000000) {
    IVar6 = 5;
  }
  else {
    if (uVar7 != 0xc000000) {
      uVar1 = (rd->argv->field_2).it;
      uVar8 = 0x23;
      if ((0xfffeffff < uVar1) && (uVar8 = 0x19, (uVar1 & 0xffff8000) != 0xffff0000)) {
        uVar8 = (ulong)(0x15 - uVar1);
      }
      o = (GCobj *)(ulong)*(uint *)((long)J + uVar8 * 4 + -0xb0);
      if (o == (GCobj *)0x0) {
        TVar5 = 0x7fff;
      }
      else {
        TVar5 = lj_ir_kgc(J,o,IRT_TAB);
      }
      goto LAB_00156c74;
    }
    IVar6 = 0xb;
  }
  iVar2 = *(int *)((ulong)(rd->argv->u32).lo + 0x10);
  (J->fold).ins.field_0.ot = 0x440b;
  (J->fold).ins.field_0.op1 = (IRRef1)uVar1;
  (J->fold).ins.field_0.op2 = IVar6;
  TVar3 = lj_opt_fold(J);
  bVar9 = iVar2 != 0;
  TVar5 = 0x7fff;
  if (bVar9) {
    TVar5 = TVar3;
  }
  TVar4 = lj_ir_knull(J,IRT_TAB);
  (J->fold).ins.field_0.ot = (ushort)bVar9 << 8 | 0x88b;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
  lj_opt_fold(J);
LAB_00156c74:
  *J->base = TVar5;
  return;
}

Assistant:

static void LJ_FASTCALL recff_debug_getmetatable(jit_State *J, RecordFFData *rd)
{
  GCtab *mt;
  TRef mtref;
  TRef tr = J->base[0];
  if (tref_istab(tr)) {
    mt = tabref(tabV(&rd->argv[0])->metatable);
    mtref = emitir(IRT(IR_FLOAD, IRT_TAB), tr, IRFL_TAB_META);
  } else if (tref_isudata(tr)) {
    mt = tabref(udataV(&rd->argv[0])->metatable);
    mtref = emitir(IRT(IR_FLOAD, IRT_TAB), tr, IRFL_UDATA_META);
  } else {
    mt = tabref(basemt_obj(J2G(J), &rd->argv[0]));
    J->base[0] = mt ? lj_ir_ktab(J, mt) : TREF_NIL;
    return;
  }
  emitir(IRTG(mt ? IR_NE : IR_EQ, IRT_TAB), mtref, lj_ir_knull(J, IRT_TAB));
  J->base[0] = mt ? mtref : TREF_NIL;
}